

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Room * newRoomFactory(itemLocation location,ItemTable *pTable)

{
  Room *this;
  string *this_00;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  switch(location) {
  case THREE_KEY_ROOM:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_b0,"keyroom",&local_1f1);
    ThreeKeyRoom::ThreeKeyRoom((ThreeKeyRoom *)this,&local_b0,pTable,true);
    this_00 = &local_b0;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/main.cpp"
                  ,0xeb,"Room *newRoomFactory(itemLocation, ItemTable *)");
  case G_ROOM1_SIDE1:
  case G_ROOM1_SIDE2:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_30,"greenRoomOne",&local_1f1);
    GreenRoomOne::GreenRoomOne((GreenRoomOne *)this,&local_30,pTable,true);
    this_00 = &local_30;
    break;
  case G_ROOM2_BUCKET:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_50,"greenRoomTwo",&local_1f1);
    GreenRoomTwo::GreenRoomTwo((GreenRoomTwo *)this,&local_50,pTable,true);
    this_00 = &local_50;
    break;
  case G_ROOM3_BASIN:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_70,"greenRoomThree",&local_1f1);
    GreenRoomThree::GreenRoomThree((GreenRoomThree *)this,&local_70,pTable,true);
    this_00 = &local_70;
    break;
  case G_ROOM4_KID:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_90,"greenRoomFour",&local_1f1);
    GreenRoomFour::GreenRoomFour((GreenRoomFour *)this,&local_90,pTable,true);
    this_00 = &local_90;
    break;
  case W_ROOM1:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_d0,"whiteRoomOne",&local_1f1);
    WhiteRoomOne::WhiteRoomOne((WhiteRoomOne *)this,&local_d0,pTable,true);
    this_00 = &local_d0;
    break;
  case W_ROOM2:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_f0,"whiteRoomTwo",&local_1f1);
    WhiteRoomTwo::WhiteRoomTwo((WhiteRoomTwo *)this,&local_f0,pTable,true);
    this_00 = &local_f0;
    break;
  case W_ROOM3:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_110,"whiteRoomThree",&local_1f1);
    WhiteRoomThree::WhiteRoomThree((WhiteRoomThree *)this,&local_110,pTable,true);
    this_00 = &local_110;
    break;
  case W_ROOM4:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_130,"whiteRoomFour",&local_1f1);
    WhiteRoomFour::WhiteRoomFour((WhiteRoomFour *)this,&local_130,pTable,true);
    this_00 = &local_130;
    break;
  case W_ROOM5:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_150,"whiteRoomFinal",&local_1f1);
    WhiteRoomFive::WhiteRoomFive((WhiteRoomFive *)this,&local_150,pTable,true);
    this_00 = &local_150;
    break;
  case B_ROOM1:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_170,"blueRoomOne",&local_1f1);
    BlueRoomOne::BlueRoomOne((BlueRoomOne *)this,&local_170,pTable,true);
    this_00 = &local_170;
    break;
  case B_ROOM2:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_190,"blueRoomTwo",&local_1f1);
    BlueRoomTwo::BlueRoomTwo((BlueRoomTwo *)this,&local_190,pTable,true);
    this_00 = &local_190;
    break;
  case B_ROOM3:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_1b0,"blueRoomThree",&local_1f1);
    BlueRoomThree::BlueRoomThree((BlueRoomThree *)this,&local_1b0,pTable,true);
    this_00 = &local_1b0;
    break;
  case B_ROOM4:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_1d0,"blueRoomFour",&local_1f1);
    BlueRoomFour::BlueRoomFour((BlueRoomFour *)this,&local_1d0,pTable,true);
    this_00 = &local_1d0;
    break;
  case B_ROOM5:
    this = (Room *)operator_new(0x138);
    std::__cxx11::string::string((string *)&local_1f0,"blueRoomFinal",&local_1f1);
    BlueRoomFive::BlueRoomFive((BlueRoomFive *)this,&local_1f0,pTable,true);
    this_00 = &local_1f0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return this;
}

Assistant:

Room *newRoomFactory(itemLocation location, ItemTable *pTable) {
    switch(location) {
        case G_ROOM1_SIDE1:
        case G_ROOM1_SIDE2:
            return new GreenRoomOne("greenRoomOne", pTable, true);
        case G_ROOM2_BUCKET :
            return new GreenRoomTwo("greenRoomTwo", pTable, true);
        case G_ROOM3_BASIN :
            return new GreenRoomThree("greenRoomThree", pTable, true);
        case G_ROOM4_KID :
            return new GreenRoomFour("greenRoomFour", pTable, true);
        case THREE_KEY_ROOM :
            return new ThreeKeyRoom("keyroom",pTable, true);
        case W_ROOM1 :
            return new WhiteRoomOne("whiteRoomOne", pTable, true);
        case W_ROOM2 :
            return new WhiteRoomTwo("whiteRoomTwo", pTable, true);
        case W_ROOM3 :
            return new WhiteRoomThree("whiteRoomThree", pTable, true);
        case W_ROOM4 :
            return new WhiteRoomFour("whiteRoomFour", pTable, true);
        case W_ROOM5 :
            return new WhiteRoomFive("whiteRoomFinal", pTable, true);
        case B_ROOM1 :
            return new BlueRoomOne("blueRoomOne", pTable, true);
        case B_ROOM2 :
            return new BlueRoomTwo("blueRoomTwo", pTable, true);
        case B_ROOM3 :
            return new BlueRoomThree("blueRoomThree", pTable, true);
        case B_ROOM4 :
            return new BlueRoomFour("blueRoomFour", pTable, true);
        case B_ROOM5 :
            return new BlueRoomFive("blueRoomFinal", pTable, true);
        default:
            assert(false);
            break;
    }
}